

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferTfOutputAttacher::drawAttachment
          (BufferTfOutputAttacher *this,GLuint buffer,Surface *dst)

{
  ostringstream *this_00;
  int iVar1;
  deUint32 err;
  undefined4 extraout_var;
  ObjectTraits *traits;
  undefined4 extraout_var_00;
  VertexArray vao;
  ObjectWrapper local_1c0;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  iVar1 = (*((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_VERTEX_ARRAY);
  glu::ObjectWrapper::ObjectWrapper(&local_1c0,(Functions *)CONCAT44(extraout_var,iVar1),traits);
  ScaleProgram::setPos(this->m_program,buffer,local_1c0.m_object);
  ScaleProgram::draw(this->m_program,local_1c0.m_object,1.0,false,dst);
  local_1a8._0_8_ = ((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_1a8 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"// Drew output image with vertices from buffer ",0x2f);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_130);
  iVar1 = (*((this->super_OutputAttacher).super_ContextWrapper.m_ctx.m_renderCtx)->
            _vptr_RenderContext[3])();
  err = (**(code **)(CONCAT44(extraout_var_00,iVar1) + 0x800))();
  glu::checkError(err,(char *)0x0,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fLifetimeTests.cpp"
                  ,0x177);
  glu::ObjectWrapper::~ObjectWrapper(&local_1c0);
  return;
}

Assistant:

void BufferTfOutputAttacher::drawAttachment (GLuint buffer, Surface& dst)
{
	VertexArray vao(getRenderContext());

	m_program.setPos(buffer, *vao);
	m_program.draw(*vao, 1.0, false, &dst);
	log() << TestLog::Message
		  << "// Drew output image with vertices from buffer " << buffer
		  << TestLog::EndMessage;
	GLU_CHECK_ERROR(gl().getError());
}